

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupMockPlugin::teardown(TEST_GROUP_CppUTestGroupMockPlugin *this)

{
  MockSupport *pMVar1;
  SimpleString SStack_18;
  
  if (this->test != (UtestShell *)0x0) {
    (*this->test->_vptr_UtestShell[1])();
  }
  if (this->result != (TestResult *)0x0) {
    (*this->result->_vptr_TestResult[1])();
  }
  SimpleString::SimpleString(&SStack_18,"");
  pMVar1 = mock(&SStack_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
  SimpleString::~SimpleString(&SStack_18);
  SimpleString::SimpleString(&SStack_18,"");
  pMVar1 = mock(&SStack_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x2f])(pMVar1);
  SimpleString::~SimpleString(&SStack_18);
  return;
}

Assistant:

void teardown() _override
    {
        delete test;
        delete result;
        mock().clear();
        mock().removeAllComparatorsAndCopiers();
    }